

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStringMeasure(PrintExpressionContents *this,StringMeasure *curr)

{
  char *pcVar1;
  ostream *o;
  string_view str;
  size_t sVar2;
  
  if (curr->op == StringMeasureWTF16) {
    o = this->o;
    pcVar1 = "string.measure_wtf16";
    sVar2 = 0x14;
  }
  else {
    if (curr->op != StringMeasureUTF8) {
      handle_unreachable("invalid string.measure*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x9cf);
    }
    o = this->o;
    pcVar1 = "string.measure_utf8";
    sVar2 = 0x13;
  }
  str._M_str = pcVar1;
  str._M_len = sVar2;
  printMedium(o,str);
  return;
}

Assistant:

void visitStringMeasure(StringMeasure* curr) {
    switch (curr->op) {
      case StringMeasureUTF8:
        printMedium(o, "string.measure_utf8");
        break;
      case StringMeasureWTF16:
        printMedium(o, "string.measure_wtf16");
        break;
      default:
        WASM_UNREACHABLE("invalid string.measure*");
    }
  }